

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_minimize_assumptions(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_4c;
  uint local_48;
  int status;
  int nResR;
  int nResL;
  int nLitsR;
  int nLitsL;
  int k;
  int i;
  int nConfLimit_local;
  int nLits_local;
  int *pLits_local;
  sat_solver *s_local;
  
  if (nLits == 1) {
    if (nConfLimit != 0) {
      s->nConfLimit = (s->stats).conflicts + (long)nConfLimit;
    }
    iVar1 = sat_solver_solve_internal(s);
    s_local._4_4_ = (uint)(iVar1 != -1);
  }
  else {
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x8ab,"int sat_solver_minimize_assumptions(sat_solver *, int *, int, int)");
    }
    iVar1 = nLits / 2;
    for (nLitsL = 0; nLitsL < iVar1; nLitsL = nLitsL + 1) {
      iVar2 = sat_solver_push(s,pLits[nLitsL]);
      if (iVar2 == 0) {
        for (nLitsR = nLitsL; -1 < nLitsR; nLitsR = nLitsR + -1) {
          sat_solver_pop(s);
        }
        iVar1 = sat_solver_minimize_assumptions(s,pLits,nLitsL + 1,nConfLimit);
        return iVar1;
      }
    }
    if (nConfLimit != 0) {
      s->nConfLimit = (s->stats).conflicts + (long)nConfLimit;
    }
    iVar2 = sat_solver_solve_internal(s);
    if (iVar2 == -1) {
      for (nLitsL = 0; nLitsL < iVar1; nLitsL = nLitsL + 1) {
        sat_solver_pop(s);
      }
      s_local._4_4_ = sat_solver_minimize_assumptions(s,pLits,iVar1,nConfLimit);
    }
    else {
      if (nLits - iVar1 == 1) {
        local_48 = 1;
      }
      else {
        local_48 = sat_solver_minimize_assumptions(s,pLits + iVar1,nLits - iVar1,nConfLimit);
      }
      for (nLitsL = 0; nLitsL < iVar1; nLitsL = nLitsL + 1) {
        sat_solver_pop(s);
      }
      veci_resize(&s->temp_clause,0);
      for (nLitsL = 0; nLitsL < iVar1; nLitsL = nLitsL + 1) {
        veci_push(&s->temp_clause,pLits[nLitsL]);
      }
      for (nLitsL = 0; nLitsL < (int)local_48; nLitsL = nLitsL + 1) {
        pLits[nLitsL] = pLits[iVar1 + nLitsL];
      }
      for (nLitsL = 0; nLitsL < iVar1; nLitsL = nLitsL + 1) {
        piVar3 = veci_begin(&s->temp_clause);
        pLits[(int)(local_48 + nLitsL)] = piVar3[nLitsL];
      }
      for (nLitsL = 0; nLitsL < (int)local_48; nLitsL = nLitsL + 1) {
        iVar2 = sat_solver_push(s,pLits[nLitsL]);
        if (iVar2 == 0) {
          for (nLitsR = nLitsL; -1 < nLitsR; nLitsR = nLitsR + -1) {
            sat_solver_pop(s);
          }
          iVar1 = sat_solver_minimize_assumptions(s,pLits,nLitsL + 1,nConfLimit);
          return iVar1;
        }
      }
      if (nConfLimit != 0) {
        s->nConfLimit = (s->stats).conflicts + (long)nConfLimit;
      }
      iVar2 = sat_solver_solve_internal(s);
      if (iVar2 == -1) {
        for (nLitsL = 0; nLitsL < (int)local_48; nLitsL = nLitsL + 1) {
          sat_solver_pop(s);
        }
        s_local._4_4_ = local_48;
      }
      else {
        if (iVar1 == 1) {
          local_4c = 1;
        }
        else {
          local_4c = sat_solver_minimize_assumptions(s,pLits + (int)local_48,iVar1,nConfLimit);
        }
        for (nLitsL = 0; nLitsL < (int)local_48; nLitsL = nLitsL + 1) {
          sat_solver_pop(s);
        }
        s_local._4_4_ = local_48 + local_4c;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

int sat_solver_minimize_assumptions( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR, status;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
        status = sat_solver_solve_internal( s );
        //printf( "%c", status == l_False ? 'u' : 's' );
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nLitsL; i++ )
            sat_solver_pop(s);
        return sat_solver_minimize_assumptions( s, pLits, nLitsL, nConfLimit );
    }
    // solve for the right lits
    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nResL; i++ )
            sat_solver_pop(s);
        return nResL;
    }
    // solve for the left lits
    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}